

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14b954f::SpeakerDelegate::speaker_did_complete_samples
          (SpeakerDelegate *this,Speaker *param_1,vector<short,_std::allocator<short>_> *buffer)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  pointer __src;
  pointer psVar4;
  const_iterator __cbeg;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->audio_buffer_mutex_);
  if (iVar2 == 0) {
    bVar1 = this->is_stereo;
    psVar3 = (this->audio_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar4 = (this->audio_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((ulong)bVar1 * 0x400 + 0x400 < (ulong)((long)psVar4 - (long)psVar3 >> 1)) &&
       (__src = (pointer)(((ulong)(byte)~bVar1 << 0xb | 0xfffffffffffff000) + (long)psVar4),
       psVar3 != __src)) {
      memmove(psVar3,__src,(ulong)bVar1 * 0x800 + 0x800);
      psVar4 = (this->audio_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish;
      psVar3 = (pointer)(((long)psVar4 - (long)__src) + (long)psVar3);
      if (psVar4 != psVar3) {
        (this->audio_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar3;
        psVar4 = psVar3;
      }
    }
    std::vector<short,std::allocator<short>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>>
              ((vector<short,std::allocator<short>> *)&this->audio_buffer_,psVar4,
               (buffer->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (buffer->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    pthread_mutex_unlock((pthread_mutex_t *)&this->audio_buffer_mutex_);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void speaker_did_complete_samples(Outputs::Speaker::Speaker *, const std::vector<int16_t> &buffer) final {
		std::lock_guard lock_guard(audio_buffer_mutex_);
		const size_t buffer_size = buffered_samples * (is_stereo ? 2 : 1);
		if(audio_buffer_.size() > buffer_size) {
			audio_buffer_.erase(audio_buffer_.begin(), audio_buffer_.end() - buffer_size);
		}
		audio_buffer_.insert(audio_buffer_.end(), buffer.begin(), buffer.end());
	}